

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFile.cc
# Opt level: O2

int __thiscall avro::DataFileReaderBase::init(DataFileReaderBase *this,EVP_PKEY_CTX *ctx)

{
  ValidSchema *this_00;
  bool bVar1;
  undefined7 extraout_var;
  ValidSchema *schema;
  ValidSchema *schema_00;
  element_type *local_98;
  shared_count sStack_90;
  shared_ptr<avro::Decoder> local_88;
  DecoderPtr local_70;
  string local_60;
  string local_40;
  
  this_00 = &this->readerSchema_;
  boost::shared_ptr<avro::Node>::operator=(&this_00->root_,(shared_ptr<avro::Node> *)ctx);
  toString_abi_cxx11_(&local_40,(avro *)this_00,schema);
  toString_abi_cxx11_(&local_60,(avro *)&this->dataSchema_,schema_00);
  bVar1 = std::operator!=(&local_40,&local_60);
  if (bVar1) {
    binaryDecoder();
    resolvingDecoder((avro *)&local_98,&this->dataSchema_,this_00,&local_70);
    local_88.px = local_98;
    local_88.pn.pi_ = sStack_90.pi_;
    local_98 = (element_type *)0x0;
    sStack_90.pi_ = (sp_counted_base *)0x0;
  }
  else {
    binaryDecoder();
  }
  boost::shared_ptr<avro::Decoder>::operator=(&this->dataDecoder_,&local_88);
  boost::detail::shared_count::~shared_count(&local_88.pn);
  if (bVar1) {
    boost::detail::shared_count::~shared_count(&sStack_90);
    boost::detail::shared_count::~shared_count(&local_70.pn);
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = readDataBlock(this);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void DataFileReaderBase::init(const ValidSchema& readerSchema)
{
    readerSchema_ = readerSchema;
    dataDecoder_  = (toString(readerSchema_) != toString(dataSchema_)) ?
        resolvingDecoder(dataSchema_, readerSchema_, binaryDecoder()) :
        binaryDecoder();
    readDataBlock();
}